

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbAbc.c
# Opt level: O1

Acb_Ntk_t * Acb_NtkFromAbc(Abc_Ntk_t *p)

{
  int iVar1;
  void *pvVar2;
  void **ppvVar3;
  long *plVar4;
  long lVar5;
  Abc_Nam_t *p_00;
  int iVar6;
  uint uVar7;
  Acb_Man_t *p_01;
  Acb_Ntk_t *p_02;
  word *pwVar8;
  Vec_Ptr_t *pVVar9;
  word wVar10;
  char *pcVar11;
  uint uVar12;
  Abc_Nam_t *in_RCX;
  ulong uVar13;
  Abc_Nam_t *in_RDX;
  Acb_ObjType_t Type;
  Abc_Nam_t *in_R8;
  Hash_IntMan_t *in_R9;
  long lVar14;
  int *piVar15;
  long lVar16;
  long lVar17;
  int local_2c;
  
  p_01 = Acb_ManAlloc(p->pSpec,0,in_RDX,in_RCX,in_R8,in_R9);
  iVar6 = Abc_NamStrFindOrAdd(p_01->pStrs,p->pName,(int *)0x0);
  uVar12 = p->vCos->nSize;
  uVar13 = (ulong)uVar12;
  p_02 = Acb_NtkAlloc(p_01,iVar6,p->vCis->nSize,uVar12,p->vObjs->nSize + -1);
  if ((p->ntkFunc != ABC_FUNC_SOP) || (p->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsSopLogic(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbAbc.c"
                  ,0x4f,"Acb_Ntk_t *Acb_NtkFromAbc(Abc_Ntk_t *)");
  }
  p_02->nFaninMax = 6;
  pVVar9 = p->vObjs;
  if (1 < pVVar9->nSize) {
    lVar16 = 1;
    do {
      uVar12 = (uint)uVar13;
      pvVar2 = pVVar9->pArray[lVar16];
      if (pvVar2 == (void *)0x0) {
        Acb_ObjAlloc(p_02,ABC_OPER_NONE,0,uVar12);
      }
      else {
        uVar7 = *(uint *)((long)pvVar2 + 0x14) & 0xf;
        if ((uVar7 == 5) || (uVar7 == 2)) {
          Type = ABC_OPER_CI;
          iVar6 = 0;
        }
        else {
          uVar12 = uVar7 - 5;
          if (uVar12 < 0xfffffffe) {
            if (uVar7 != 7) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbAbc.c"
                            ,0x5c,"Acb_Ntk_t *Acb_NtkFromAbc(Abc_Ntk_t *)");
            }
            iVar6 = *(int *)((long)pvVar2 + 0x1c);
            Type = ABC_OPER_LUT;
          }
          else {
            Type = ABC_OPER_CO;
            iVar6 = 1;
          }
        }
        iVar6 = Acb_ObjAlloc(p_02,Type,iVar6,uVar12);
        *(int *)((long)pvVar2 + 0x40) = iVar6;
      }
      if ((pvVar2 != (void *)0x0) &&
         (*(int *)((long)pvVar2 + 0x40) != *(int *)((long)pvVar2 + 0x10))) {
        __assert_fail("pObj == NULL || pObj->iTemp == (int)Abc_ObjId(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbAbc.c"
                      ,0x5d,"Acb_Ntk_t *Acb_NtkFromAbc(Abc_Ntk_t *)");
      }
      lVar16 = lVar16 + 1;
      pVVar9 = p->vObjs;
      uVar13 = (ulong)pVVar9->nSize;
    } while (lVar16 < (long)uVar13);
  }
  if (0 < pVVar9->nSize) {
    ppvVar3 = pVVar9->pArray;
    lVar16 = 0;
    do {
      plVar4 = (long *)ppvVar3[lVar16];
      if (((plVar4 != (long *)0x0) && ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 7)) &&
         (0 < *(int *)((long)plVar4 + 0x1c))) {
        lVar17 = plVar4[4];
        lVar5 = *(long *)(*(long *)(*plVar4 + 0x20) + 8);
        lVar14 = 0;
        do {
          iVar6 = (int)plVar4[8];
          if ((long)iVar6 < 1) goto LAB_0038da14;
          if ((p_02->vObjFans).nSize <= iVar6) goto LAB_0038d9f5;
          iVar6 = (p_02->vObjFans).pArray[iVar6];
          if (((long)iVar6 < 0) || ((p_02->vFanSto).nSize <= iVar6)) goto LAB_0038d998;
          iVar1 = *(int *)(*(long *)(lVar5 + (long)*(int *)(lVar17 + lVar14 * 4) * 8) + 0x40);
          if (iVar1 < 1) goto LAB_0038d9d6;
          piVar15 = (p_02->vFanSto).pArray + iVar6;
          iVar6 = *piVar15;
          if (piVar15[(long)iVar6 + 1] != -1) goto LAB_0038d9b7;
          *piVar15 = iVar6 + 1;
          piVar15[(long)iVar6 + 1] = iVar1;
          lVar14 = lVar14 + 1;
        } while (lVar14 < *(int *)((long)plVar4 + 0x1c));
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVVar9->nSize);
  }
  pVVar9 = p->vCos;
  if (0 < pVVar9->nSize) {
    ppvVar3 = pVVar9->pArray;
    lVar16 = 0;
    do {
      plVar4 = (long *)ppvVar3[lVar16];
      iVar6 = (int)plVar4[8];
      if ((long)iVar6 < 1) {
LAB_0038da14:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
      }
      if ((p_02->vObjFans).nSize <= iVar6) {
LAB_0038d9f5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = (p_02->vObjFans).pArray[iVar6];
      if (((long)iVar6 < 0) || ((p_02->vFanSto).nSize <= iVar6)) {
LAB_0038d998:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      iVar1 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                (long)*(int *)plVar4[4] * 8) + 0x40);
      if (iVar1 < 1) {
LAB_0038d9d6:
        __assert_fail("iFanin > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x1a3,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
      }
      piVar15 = (p_02->vFanSto).pArray + iVar6;
      iVar6 = *piVar15;
      if (piVar15[(long)iVar6 + 1] != -1) {
LAB_0038d9b7:
        __assert_fail("pFanins[ 1 + pFanins[0] ] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x1a4,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
      }
      *piVar15 = iVar6 + 1;
      piVar15[(long)iVar6 + 1] = iVar1;
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVVar9->nSize);
  }
  uVar12 = (p_02->vObjType).nCap;
  if ((p_02->vObjTruth).nCap < (int)uVar12) {
    pwVar8 = (p_02->vObjTruth).pArray;
    if (pwVar8 == (word *)0x0) {
      pwVar8 = (word *)malloc((long)(int)uVar12 << 3);
    }
    else {
      pwVar8 = (word *)realloc(pwVar8,(long)(int)uVar12 << 3);
    }
    (p_02->vObjTruth).pArray = pwVar8;
    if (pwVar8 == (word *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    (p_02->vObjTruth).nCap = uVar12;
  }
  if (0 < (int)uVar12) {
    memset((p_02->vObjTruth).pArray,0,(ulong)uVar12 * 8);
  }
  (p_02->vObjTruth).nSize = uVar12;
  pVVar9 = p->vObjs;
  if (0 < pVVar9->nSize) {
    lVar16 = 0;
    do {
      pvVar2 = pVVar9->pArray[lVar16];
      if ((pvVar2 != (void *)0x0) && ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 7)) {
        iVar6 = *(int *)((long)pvVar2 + 0x40);
        lVar17 = (long)iVar6;
        wVar10 = Abc_SopToTruth(*(char **)((long)pvVar2 + 0x38),*(int *)((long)pvVar2 + 0x1c));
        if (lVar17 < 1) {
          pcVar11 = "i>0";
LAB_0038da81:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
        }
        iVar1 = (p_02->vObjTruth).nSize;
        if (iVar1 < 1) {
          pcVar11 = "Acb_NtkHasObjTruths(p)";
          goto LAB_0038da81;
        }
        if (iVar1 <= iVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
        }
        pwVar8 = (p_02->vObjTruth).pArray;
        if (pwVar8[lVar17] != 0) {
          __assert_fail("Acb_ObjTruth(p, i) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0x11d,"void Acb_ObjSetTruth(Acb_Ntk_t *, int, word)");
        }
        pwVar8[lVar17] = wVar10;
      }
      lVar16 = lVar16 + 1;
      pVVar9 = p->vObjs;
    } while (lVar16 < pVVar9->nSize);
  }
  p_02->nRegs = p->nObjCounts[8];
  p_00 = p_01->pMods;
  pcVar11 = Abc_NamStr(p_02->pDesign->pStrs,p_02->NameId);
  iVar6 = Abc_NamStrFindOrAdd(p_00,pcVar11,&local_2c);
  if (local_2c == 0) {
    if (iVar6 != p_02->Id) {
      __assert_fail("NtkId == pNtk->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                    ,0x2a0,"void Acb_NtkAdd(Acb_Man_t *, Acb_Ntk_t *)");
    }
  }
  else {
    pcVar11 = Abc_NamStr(p_02->pDesign->pStrs,p_02->NameId);
    printf("Network with name \"%s\" already exists.\n",pcVar11);
  }
  return p_02;
}

Assistant:

Acb_Ntk_t * Acb_NtkFromAbc( Abc_Ntk_t * p )
{
    Acb_Man_t * pMan = Acb_ManAlloc( Abc_NtkSpec(p), 1, NULL, NULL, NULL, NULL );
    int i, k, NameId = Abc_NamStrFindOrAdd( pMan->pStrs, Abc_NtkName(p), NULL );
    Acb_Ntk_t * pNtk = Acb_NtkAlloc( pMan, NameId, Abc_NtkCiNum(p), Abc_NtkCoNum(p), Abc_NtkObjNumMax(p)-1 );
    Abc_Obj_t * pObj, * pFanin;
    assert( Abc_NtkIsSopLogic(p) );
    pNtk->nFaninMax = 6;
    for ( i = 1; i < Abc_NtkObjNumMax(p); i++ )
    {
        pObj = Abc_NtkObj( p, i );
        if ( pObj == NULL )
            Acb_ObjAlloc( pNtk, ABC_OPER_NONE, 0, 0 );
        else if ( Abc_ObjIsCi(pObj) )
            pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_CI, 0, 0 );
        else if ( Abc_ObjIsCo(pObj) )
            pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_CO, 1, 0 );
        else if ( Abc_ObjIsNode(pObj) )
            pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_LUT, Abc_ObjFaninNum(pObj), 0 );
        else assert( 0 );
        assert( pObj == NULL || pObj->iTemp == (int)Abc_ObjId(pObj) );
    }
    Abc_NtkForEachNode( p, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Acb_ObjAddFanin( pNtk, pObj->iTemp, pFanin->iTemp );
    Abc_NtkForEachCo( p, pObj, i )
        Acb_ObjAddFanin( pNtk, pObj->iTemp, Abc_ObjFanin(pObj, 0)->iTemp );
    Acb_NtkCleanObjTruths( pNtk );
    Abc_NtkForEachNode( p, pObj, i )
        Acb_ObjSetTruth( pNtk, pObj->iTemp, Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj)) );
    Acb_NtkSetRegNum( pNtk, Abc_NtkLatchNum(p) );
    Acb_NtkAdd( pMan, pNtk );
    return pNtk;
}